

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * HelpExampleRpcNamed(string *__return_storage_ptr__,string *methodname,RPCArgList *args)

{
  long lVar1;
  pointer ppVar2;
  string str;
  string key;
  pointer __str;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe58;
  UniValue in_stack_fffffffffffffe68;
  UniValue local_128;
  string local_d0 [32];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue params;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  str._M_string_length = (size_type)__return_storage_ptr__;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  str.field_2 = in_stack_fffffffffffffe58;
  UniValue::UniValue(&params,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_b0);
  ppVar2 = (args->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__str = (args->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __str != ppVar2; __str = __str + 1) {
    std::__cxx11::string::string(local_d0,&__str->first);
    UniValue::UniValue(&local_128,&__str->second);
    key._M_string_length = (size_type)__return_storage_ptr__;
    key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
    key.field_2 = in_stack_fffffffffffffe58;
    UniValue::pushKV(&params,key,in_stack_fffffffffffffe68);
    UniValue::~UniValue(&local_128);
    std::__cxx11::string::~string(local_d0);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe78,
                 "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \""
                 ,methodname);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe78,"\", \"params\": ");
  UniValue::write_abi_cxx11_((UniValue *)&stack0xfffffffffffffe58,(int)&params,(void *)0x0,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe58);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffeb8,
                 "}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n");
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  UniValue::~UniValue(&params);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpExampleRpcNamed(const std::string& methodname, const RPCArgList& args)
{
    UniValue params(UniValue::VOBJ);
    for (const auto& param: args) {
        params.pushKV(param.first, param.second);
    }

    return "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", "
           "\"method\": \"" + methodname + "\", \"params\": " + params.write() + "}' -H 'content-type: application/json' http://127.0.0.1:8332/\n";
}